

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sisd_alignment_engine.cpp
# Opt level: O0

void __thiscall
spoa::SisdAlignmentEngine::Initialize
          (SisdAlignmentEngine *this,char *sequence,uint32_t sequence_len,Graph *graph)

{
  char cVar1;
  char cVar2;
  AlignmentSubtype AVar3;
  AlignmentType AVar4;
  value_type vVar5;
  int32_t iVar6;
  int32_t *piVar7;
  vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_> *pvVar8;
  uint32_t uVar9;
  bool bVar10;
  uint32_t uVar11;
  vector<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
  *this_00;
  size_type sVar12;
  pointer pIVar13;
  reference pvVar14;
  ulong uVar15;
  const_reference ppNVar16;
  reference pvVar17;
  int *piVar18;
  reference ppEVar19;
  int iVar20;
  uint uVar21;
  int local_1a4;
  int local_184;
  char local_152;
  uint local_134;
  uint local_130;
  uint32_t i_8;
  uint32_t j_9;
  uint32_t j_8;
  uint32_t j_7;
  uint32_t pred_i_2;
  Edge **it_2;
  const_iterator __end4;
  const_iterator __begin4;
  vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_> *__range4;
  vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_> *pvStack_f8;
  int32_t penalty_2;
  vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_> *edges_2;
  uint local_e8;
  uint32_t i_7;
  uint32_t j_6;
  uint32_t i_6;
  uint32_t j_5;
  uint32_t i_5;
  uint32_t j_4;
  uint32_t i_4;
  uint32_t j_3;
  uint32_t pred_i_1;
  Edge **it_1;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_> *__range3_1;
  vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_> *pvStack_a0;
  int32_t penalty_1;
  vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_> *edges_1;
  uint local_90;
  uint32_t i_3;
  uint32_t j_2;
  uint32_t pred_i;
  Edge **it;
  const_iterator __end3;
  const_iterator __begin3;
  vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_> *__range3;
  vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_> *pvStack_60;
  int32_t penalty;
  vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_> *edges;
  uint local_50;
  uint32_t i_2;
  uint32_t j_1;
  uint32_t i_1;
  vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> *rank_to_node;
  uint8_t local_35;
  uint32_t j;
  uint uStack_30;
  char c;
  uint32_t i;
  uint32_t matrix_height;
  uint32_t matrix_width;
  Graph *graph_local;
  char *pcStack_18;
  uint32_t sequence_len_local;
  char *sequence_local;
  SisdAlignmentEngine *this_local;
  
  i = sequence_len + 1;
  _matrix_height = graph;
  graph_local._4_4_ = sequence_len;
  pcStack_18 = sequence;
  sequence_local = (char *)this;
  this_00 = Graph::nodes(graph);
  sVar12 = std::
           vector<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
           ::size(this_00);
  uStack_30 = (int)sVar12 + 1;
  for (j = 0; uVar9 = j, uVar11 = Graph::num_codes(_matrix_height), uVar9 < uVar11; j = j + 1) {
    local_35 = Graph::decoder(_matrix_height,(uint8_t)j);
    pIVar13 = std::
              unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
              ::operator->(&this->pimpl_);
    pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                        (&pIVar13->sequence_profile,(ulong)(j * i));
    *pvVar14 = 0;
    for (rank_to_node._4_4_ = 0; rank_to_node._4_4_ < graph_local._4_4_;
        rank_to_node._4_4_ = rank_to_node._4_4_ + 1) {
      if (local_35 == pcStack_18[rank_to_node._4_4_]) {
        local_152 = (this->super_AlignmentEngine).m_;
      }
      else {
        local_152 = (this->super_AlignmentEngine).n_;
      }
      pIVar13 = std::
                unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                ::operator->(&this->pimpl_);
      pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                          (&pIVar13->sequence_profile,(ulong)(j * i + rank_to_node._4_4_ + 1));
      *pvVar14 = (int)local_152;
    }
  }
  _j_1 = Graph::rank_to_node(_matrix_height);
  for (i_2 = 0; uVar15 = (ulong)i_2,
      sVar12 = std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::size(_j_1),
      uVar9 = i_2, uVar15 < sVar12; i_2 = i_2 + 1) {
    pIVar13 = std::
              unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
              ::operator->(&this->pimpl_);
    ppNVar16 = std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::operator[]
                         (_j_1,(ulong)i_2);
    pvVar17 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        (&pIVar13->node_id_to_rank,(ulong)(*ppNVar16)->id);
    *pvVar17 = uVar9;
  }
  AVar3 = (this->super_AlignmentEngine).subtype_;
  if (AVar3 != kLinear) {
    if (AVar3 != kAffine) {
      if (AVar3 != kConvex) goto LAB_0014ce9c;
      pIVar13 = std::
                unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                ::operator->(&this->pimpl_);
      *pIVar13->O = 0;
      pIVar13 = std::
                unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                ::operator->(&this->pimpl_);
      *pIVar13->Q = 0;
      for (local_50 = 1; local_50 < i; local_50 = local_50 + 1) {
        pIVar13 = std::
                  unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                  ::operator->(&this->pimpl_);
        pIVar13->O[local_50] = -0x7ffffc00;
        cVar1 = (this->super_AlignmentEngine).q_;
        iVar20 = local_50 - 1;
        cVar2 = (this->super_AlignmentEngine).c_;
        pIVar13 = std::
                  unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                  ::operator->(&this->pimpl_);
        pIVar13->Q[local_50] = (int)cVar1 + iVar20 * cVar2;
      }
      for (edges._4_4_ = 1; edges._4_4_ < uStack_30; edges._4_4_ = edges._4_4_ + 1) {
        ppNVar16 = std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::
                   operator[](_j_1,(ulong)(edges._4_4_ - 1));
        pvStack_60 = &(*ppNVar16)->inedges;
        bVar10 = std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>::empty
                           (pvStack_60);
        pvVar8 = pvStack_60;
        if (bVar10) {
          local_184 = (int)(this->super_AlignmentEngine).q_ - (int)(this->super_AlignmentEngine).c_;
        }
        else {
          local_184 = -0x7ffffc00;
        }
        __range3._4_4_ = local_184;
        __end3 = std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>::begin
                           (pvStack_60);
        it = (Edge **)std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>::end
                                (pvVar8);
        while (bVar10 = __gnu_cxx::operator!=
                                  (&__end3,(__normal_iterator<spoa::Graph::Edge_*const_*,_std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>_>
                                            *)&it), bVar10) {
          _j_2 = __gnu_cxx::
                 __normal_iterator<spoa::Graph::Edge_*const_*,_std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>_>
                 ::operator*(&__end3);
          pIVar13 = std::
                    unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                    ::operator->(&this->pimpl_);
          pvVar17 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              (&pIVar13->node_id_to_rank,(ulong)(*_j_2)->tail->id);
          i_3 = *pvVar17 + 1;
          pIVar13 = std::
                    unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                    ::operator->(&this->pimpl_);
          piVar18 = std::max<int>((int *)((long)&__range3 + 4),pIVar13->O + i_3 * i);
          __range3._4_4_ = *piVar18;
          __gnu_cxx::
          __normal_iterator<spoa::Graph::Edge_*const_*,_std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>_>
          ::operator++(&__end3);
        }
        iVar20 = __range3._4_4_ + (this->super_AlignmentEngine).c_;
        pIVar13 = std::
                  unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                  ::operator->(&this->pimpl_);
        pIVar13->O[edges._4_4_ * i] = iVar20;
        pIVar13 = std::
                  unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                  ::operator->(&this->pimpl_);
        pIVar13->Q[edges._4_4_ * i] = -0x7ffffc00;
      }
    }
    pIVar13 = std::
              unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
              ::operator->(&this->pimpl_);
    *pIVar13->F = 0;
    pIVar13 = std::
              unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
              ::operator->(&this->pimpl_);
    *pIVar13->E = 0;
    for (local_90 = 1; local_90 < i; local_90 = local_90 + 1) {
      pIVar13 = std::
                unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                ::operator->(&this->pimpl_);
      pIVar13->F[local_90] = -0x7ffffc00;
      cVar1 = (this->super_AlignmentEngine).g_;
      iVar20 = local_90 - 1;
      cVar2 = (this->super_AlignmentEngine).e_;
      pIVar13 = std::
                unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                ::operator->(&this->pimpl_);
      pIVar13->E[local_90] = (int)cVar1 + iVar20 * cVar2;
    }
    for (edges_1._4_4_ = 1; edges_1._4_4_ < uStack_30; edges_1._4_4_ = edges_1._4_4_ + 1) {
      ppNVar16 = std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::operator[]
                           (_j_1,(ulong)(edges_1._4_4_ - 1));
      pvStack_a0 = &(*ppNVar16)->inedges;
      bVar10 = std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>::empty
                         (pvStack_a0);
      pvVar8 = pvStack_a0;
      if (bVar10) {
        local_1a4 = (int)(this->super_AlignmentEngine).g_ - (int)(this->super_AlignmentEngine).e_;
      }
      else {
        local_1a4 = -0x7ffffc00;
      }
      __range3_1._4_4_ = local_1a4;
      __end3_1 = std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>::begin
                           (pvStack_a0);
      it_1 = (Edge **)std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>::end
                                (pvVar8);
      while (bVar10 = __gnu_cxx::operator!=
                                (&__end3_1,
                                 (__normal_iterator<spoa::Graph::Edge_*const_*,_std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>_>
                                  *)&it_1), bVar10) {
        _j_3 = __gnu_cxx::
               __normal_iterator<spoa::Graph::Edge_*const_*,_std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>_>
               ::operator*(&__end3_1);
        pIVar13 = std::
                  unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                  ::operator->(&this->pimpl_);
        pvVar17 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            (&pIVar13->node_id_to_rank,(ulong)(*_j_3)->tail->id);
        i_4 = *pvVar17 + 1;
        pIVar13 = std::
                  unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                  ::operator->(&this->pimpl_);
        piVar18 = std::max<int>((int *)((long)&__range3_1 + 4),pIVar13->F + i_4 * i);
        __range3_1._4_4_ = *piVar18;
        __gnu_cxx::
        __normal_iterator<spoa::Graph::Edge_*const_*,_std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>_>
        ::operator++(&__end3_1);
      }
      iVar20 = __range3_1._4_4_ + (this->super_AlignmentEngine).e_;
      pIVar13 = std::
                unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                ::operator->(&this->pimpl_);
      pIVar13->F[edges_1._4_4_ * i] = iVar20;
      pIVar13 = std::
                unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                ::operator->(&this->pimpl_);
      pIVar13->E[edges_1._4_4_ * i] = -0x7ffffc00;
    }
  }
  pIVar13 = std::
            unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
            ::operator->(&this->pimpl_);
  *pIVar13->H = 0;
LAB_0014ce9c:
  AVar4 = (this->super_AlignmentEngine).type_;
  if (AVar4 == kSW) {
    for (j_4 = 1; j_4 < i; j_4 = j_4 + 1) {
      pIVar13 = std::
                unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                ::operator->(&this->pimpl_);
      pIVar13->H[j_4] = 0;
    }
    for (i_5 = 1; i_5 < uStack_30; i_5 = i_5 + 1) {
      pIVar13 = std::
                unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                ::operator->(&this->pimpl_);
      pIVar13->H[i_5 * i] = 0;
    }
  }
  else if (AVar4 == kNW) {
    AVar3 = (this->super_AlignmentEngine).subtype_;
    if (AVar3 == kLinear) {
      for (local_e8 = 1; local_e8 < i; local_e8 = local_e8 + 1) {
        iVar20 = local_e8 * (int)(this->super_AlignmentEngine).g_;
        pIVar13 = std::
                  unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                  ::operator->(&this->pimpl_);
        pIVar13->H[local_e8] = iVar20;
      }
      for (edges_2._4_4_ = 1; edges_2._4_4_ < uStack_30; edges_2._4_4_ = edges_2._4_4_ + 1) {
        ppNVar16 = std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::
                   operator[](_j_1,(ulong)(edges_2._4_4_ - 1));
        pvStack_f8 = &(*ppNVar16)->inedges;
        bVar10 = std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>::empty
                           (pvStack_f8);
        pvVar8 = pvStack_f8;
        __range4._4_4_ = -0x7ffffc00;
        if (bVar10) {
          __range4._4_4_ = 0;
        }
        __end4 = std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>::begin
                           (pvStack_f8);
        it_2 = (Edge **)std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>::end
                                  (pvVar8);
        while (bVar10 = __gnu_cxx::operator!=
                                  (&__end4,(__normal_iterator<spoa::Graph::Edge_*const_*,_std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>_>
                                            *)&it_2), bVar10) {
          ppEVar19 = __gnu_cxx::
                     __normal_iterator<spoa::Graph::Edge_*const_*,_std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>_>
                     ::operator*(&__end4);
          pIVar13 = std::
                    unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                    ::operator->(&this->pimpl_);
          pvVar17 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              (&pIVar13->node_id_to_rank,(ulong)(*ppEVar19)->tail->id);
          vVar5 = *pvVar17;
          pIVar13 = std::
                    unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                    ::operator->(&this->pimpl_);
          piVar18 = std::max<int>((int *)((long)&__range4 + 4),pIVar13->H + (vVar5 + 1) * i);
          __range4._4_4_ = *piVar18;
          __gnu_cxx::
          __normal_iterator<spoa::Graph::Edge_*const_*,_std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>_>
          ::operator++(&__end4);
        }
        iVar20 = __range4._4_4_ + (this->super_AlignmentEngine).g_;
        pIVar13 = std::
                  unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                  ::operator->(&this->pimpl_);
        pIVar13->H[edges_2._4_4_ * i] = iVar20;
      }
    }
    else if (AVar3 == kAffine) {
      for (j_6 = 1; j_6 < i; j_6 = j_6 + 1) {
        pIVar13 = std::
                  unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                  ::operator->(&this->pimpl_);
        iVar6 = pIVar13->E[j_6];
        pIVar13 = std::
                  unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                  ::operator->(&this->pimpl_);
        pIVar13->H[j_6] = iVar6;
      }
      for (i_7 = 1; i_7 < uStack_30; i_7 = i_7 + 1) {
        pIVar13 = std::
                  unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                  ::operator->(&this->pimpl_);
        iVar6 = pIVar13->F[i_7 * i];
        pIVar13 = std::
                  unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                  ::operator->(&this->pimpl_);
        pIVar13->H[i_7 * i] = iVar6;
      }
    }
    else if (AVar3 == kConvex) {
      for (j_5 = 1; j_5 < i; j_5 = j_5 + 1) {
        pIVar13 = std::
                  unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                  ::operator->(&this->pimpl_);
        piVar7 = pIVar13->Q;
        uVar15 = (ulong)j_5;
        pIVar13 = std::
                  unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                  ::operator->(&this->pimpl_);
        piVar18 = std::max<int>(piVar7 + uVar15,pIVar13->E + j_5);
        iVar20 = *piVar18;
        pIVar13 = std::
                  unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                  ::operator->(&this->pimpl_);
        pIVar13->H[j_5] = iVar20;
      }
      for (i_6 = 1; i_6 < uStack_30; i_6 = i_6 + 1) {
        pIVar13 = std::
                  unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                  ::operator->(&this->pimpl_);
        piVar7 = pIVar13->O;
        uVar21 = i_6 * i;
        pIVar13 = std::
                  unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                  ::operator->(&this->pimpl_);
        piVar18 = std::max<int>(piVar7 + uVar21,pIVar13->F + i_6 * i);
        iVar20 = *piVar18;
        pIVar13 = std::
                  unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                  ::operator->(&this->pimpl_);
        pIVar13->H[i_6 * i] = iVar20;
      }
    }
  }
  else if (AVar4 == kOV) {
    AVar3 = (this->super_AlignmentEngine).subtype_;
    if (AVar3 == kLinear) {
      for (local_130 = 1; local_130 < i; local_130 = local_130 + 1) {
        cVar1 = (this->super_AlignmentEngine).g_;
        pIVar13 = std::
                  unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                  ::operator->(&this->pimpl_);
        pIVar13->H[local_130] = local_130 * (int)cVar1;
      }
    }
    else if (AVar3 == kAffine) {
      for (i_8 = 1; i_8 < i; i_8 = i_8 + 1) {
        pIVar13 = std::
                  unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                  ::operator->(&this->pimpl_);
        iVar6 = pIVar13->E[i_8];
        pIVar13 = std::
                  unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                  ::operator->(&this->pimpl_);
        pIVar13->H[i_8] = iVar6;
      }
    }
    else if (AVar3 == kConvex) {
      for (j_9 = 1; j_9 < i; j_9 = j_9 + 1) {
        pIVar13 = std::
                  unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                  ::operator->(&this->pimpl_);
        piVar7 = pIVar13->Q;
        pIVar13 = std::
                  unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                  ::operator->(&this->pimpl_);
        piVar18 = std::max<int>(piVar7 + j_9,pIVar13->E + j_9);
        iVar20 = *piVar18;
        pIVar13 = std::
                  unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                  ::operator->(&this->pimpl_);
        pIVar13->H[j_9] = iVar20;
      }
    }
    for (local_134 = 1; local_134 < uStack_30; local_134 = local_134 + 1) {
      pIVar13 = std::
                unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                ::operator->(&this->pimpl_);
      pIVar13->H[local_134 * i] = 0;
    }
  }
  return;
}

Assistant:

void SisdAlignmentEngine::Initialize(
    const char* sequence, std::uint32_t sequence_len,
    const Graph& graph) noexcept {
  std::uint32_t matrix_width = sequence_len + 1;
  std::uint32_t matrix_height = graph.nodes().size() + 1;

  for (std::uint32_t i = 0; i < graph.num_codes(); ++i) {
    char c = graph.decoder(i);
    pimpl_->sequence_profile[i * matrix_width] = 0;
    for (std::uint32_t j = 0; j < sequence_len; ++j) {
      pimpl_->sequence_profile[i * matrix_width + (j + 1)] =
          (c == sequence[j] ? m_ : n_);
    }
  }

  const auto& rank_to_node = graph.rank_to_node();
  for (std::uint32_t i = 0; i < rank_to_node.size(); ++i) {
    pimpl_->node_id_to_rank[rank_to_node[i]->id] = i;
  }

  // initialize secondary matrices
  switch (subtype_) {
    case AlignmentSubtype::kConvex:
      pimpl_->O[0] = 0;
      pimpl_->Q[0] = 0;
      for (std::uint32_t j = 1; j < matrix_width; ++j) {
        pimpl_->O[j] = kNegativeInfinity;
        pimpl_->Q[j] = q_ + (j - 1) * c_;
      }
      for (std::uint32_t i = 1; i < matrix_height; ++i) {
        const auto& edges = rank_to_node[i - 1]->inedges;
        std::int32_t penalty = edges.empty() ? q_ - c_ : kNegativeInfinity;
        for (const auto& it : edges) {
          std::uint32_t pred_i = pimpl_->node_id_to_rank[it->tail->id] + 1;
          penalty = std::max(penalty, pimpl_->O[pred_i * matrix_width]);
        }
        pimpl_->O[i * matrix_width] = penalty + c_;
        pimpl_->Q[i * matrix_width] = kNegativeInfinity;
      }
      // fall through
    case AlignmentSubtype::kAffine:
      pimpl_->F[0] = 0;
      pimpl_->E[0] = 0;
      for (std::uint32_t j = 1; j < matrix_width; ++j) {
        pimpl_->F[j] = kNegativeInfinity;
        pimpl_->E[j] = g_ + (j - 1) * e_;
      }
      for (std::uint32_t i = 1; i < matrix_height; ++i) {
        const auto& edges = rank_to_node[i - 1]->inedges;
        std::int32_t penalty = edges.empty() ? g_ - e_ : kNegativeInfinity;
        for (const auto& it : edges) {
          std::uint32_t pred_i = pimpl_->node_id_to_rank[it->tail->id] + 1;
          penalty = std::max(penalty, pimpl_->F[pred_i * matrix_width]);
        }
        pimpl_->F[i * matrix_width] = penalty + e_;
        pimpl_->E[i * matrix_width] = kNegativeInfinity;
      }
      // fall through
    case AlignmentSubtype::kLinear:
      pimpl_->H[0] = 0;
      break;
    default:
      break;
  }

  // initialize primary matrix
  switch (type_) {
    case AlignmentType::kSW:
      for (std::uint32_t j = 1; j < matrix_width; ++j) {
        pimpl_->H[j] = 0;
      }
      for (std::uint32_t i = 1; i < matrix_height; ++i) {
        pimpl_->H[i * matrix_width] = 0;
      }
      break;
    case AlignmentType::kNW:
      switch (subtype_) {
        case AlignmentSubtype::kConvex:
          for (std::uint32_t j = 1; j < matrix_width; ++j) {
            pimpl_->H[j] = std::max(pimpl_->Q[j], pimpl_->E[j]);
          }
          for (std::uint32_t i = 1; i < matrix_height; ++i) {
            pimpl_->H[i * matrix_width] = std::max(
                pimpl_->O[i * matrix_width],
                pimpl_->F[i * matrix_width]);
          }
          break;
        case AlignmentSubtype::kAffine:
          for (std::uint32_t j = 1; j < matrix_width; ++j) {
            pimpl_->H[j] = pimpl_->E[j];
          }
          for (std::uint32_t i = 1; i < matrix_height; ++i) {
            pimpl_->H[i * matrix_width] = pimpl_->F[i * matrix_width];
          }
          break;
        case AlignmentSubtype::kLinear:
          for (std::uint32_t j = 1; j < matrix_width; ++j) {
            pimpl_->H[j] = j * g_;
          }
          for (std::uint32_t i = 1; i < matrix_height; ++i) {
            const auto& edges = rank_to_node[i - 1]->inedges;
            std::int32_t penalty = edges.empty() ? 0 : kNegativeInfinity;
            for (const auto& it : edges) {
              std::uint32_t pred_i = pimpl_->node_id_to_rank[it->tail->id] + 1;
              penalty = std::max(penalty, pimpl_->H[pred_i * matrix_width]);
            }
            pimpl_->H[i * matrix_width] = penalty + g_;
          }
        default:
          break;
      }
      break;
    case AlignmentType::kOV:
      switch (subtype_) {
        case AlignmentSubtype::kConvex:
          for (std::uint32_t j = 1; j < matrix_width; ++j) {
            pimpl_->H[j] = std::max(pimpl_->Q[j], pimpl_->E[j]);
          }
          break;
        case AlignmentSubtype::kAffine:
          for (std::uint32_t j = 1; j < matrix_width; ++j) {
            pimpl_->H[j] = pimpl_->E[j];
          }
          break;
        case AlignmentSubtype::kLinear:
          for (std::uint32_t j = 1; j < matrix_width; ++j) {
            pimpl_->H[j] = j * g_;
          }
          break;
        default:
          break;
      }
      for (std::uint32_t i = 1; i < matrix_height; ++i) {
        pimpl_->H[i * matrix_width] = 0;
      }
      break;
    default:
      break;
  }
}